

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_aux.c
# Opt level: O1

int TIFFDefaultTransferFunction(TIFF *tif,TIFFDirectory *td)

{
  uint16_t **ppuVar1;
  double dVar2;
  uint16_t *puVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  long s;
  long lVar7;
  
  td->td_transferfunction[0] = (uint16_t *)0x0;
  td->td_transferfunction[1] = (uint16_t *)0x0;
  td->td_transferfunction[2] = (uint16_t *)0x0;
  iVar5 = 0;
  if (0x3d < td->td_bitspersample) {
    return 0;
  }
  ppuVar1 = td->td_transferfunction;
  bVar4 = (byte)td->td_bitspersample;
  lVar6 = 1L << (bVar4 & 0x3f);
  s = 2L << (bVar4 & 0x3f);
  puVar3 = (uint16_t *)_TIFFmallocExt(tif,s);
  *ppuVar1 = puVar3;
  if (puVar3 == (uint16_t *)0x0) {
    return 0;
  }
  *puVar3 = 0;
  if (1 < lVar6) {
    lVar7 = 1;
    do {
      dVar2 = pow((double)lVar7 / ((double)lVar6 + -1.0),2.2);
      dVar2 = floor(dVar2 * 65535.0 + 0.5);
      (*ppuVar1)[lVar7] = (uint16_t)(int)dVar2;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  if ((int)((uint)td->td_samplesperpixel - (uint)td->td_extrasamples) < 2) {
LAB_0028e7a7:
    iVar5 = 1;
  }
  else {
    puVar3 = (uint16_t *)_TIFFmallocExt(tif,s);
    td->td_transferfunction[1] = puVar3;
    if (puVar3 != (uint16_t *)0x0) {
      _TIFFmemcpy(puVar3,td->td_transferfunction[0],s);
      puVar3 = (uint16_t *)_TIFFmallocExt(tif,s);
      td->td_transferfunction[2] = puVar3;
      if (puVar3 != (uint16_t *)0x0) {
        _TIFFmemcpy(puVar3,*ppuVar1,s);
        goto LAB_0028e7a7;
      }
    }
    if (*ppuVar1 != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,*ppuVar1);
    }
    if (td->td_transferfunction[1] != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,td->td_transferfunction[1]);
    }
    if (td->td_transferfunction[2] != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,td->td_transferfunction[2]);
    }
    *ppuVar1 = (uint16_t *)0x0;
    td->td_transferfunction[1] = (uint16_t *)0x0;
    td->td_transferfunction[2] = (uint16_t *)0x0;
  }
  return iVar5;
}

Assistant:

static int TIFFDefaultTransferFunction(TIFF *tif, TIFFDirectory *td)
{
    uint16_t **tf = td->td_transferfunction;
    tmsize_t i, n, nbytes;

    tf[0] = tf[1] = tf[2] = 0;
    if (td->td_bitspersample >= sizeof(tmsize_t) * 8 - 2)
        return 0;

    n = ((tmsize_t)1) << td->td_bitspersample;
    nbytes = n * sizeof(uint16_t);
    tf[0] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
    if (tf[0] == NULL)
        return 0;
    tf[0][0] = 0;
    for (i = 1; i < n; i++)
    {
        double t = (double)i / ((double)n - 1.);
        tf[0][i] = (uint16_t)floor(65535. * pow(t, 2.2) + .5);
    }

    if (td->td_samplesperpixel - td->td_extrasamples > 1)
    {
        tf[1] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
        if (tf[1] == NULL)
            goto bad;
        _TIFFmemcpy(tf[1], tf[0], nbytes);
        tf[2] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
        if (tf[2] == NULL)
            goto bad;
        _TIFFmemcpy(tf[2], tf[0], nbytes);
    }
    return 1;

bad:
    if (tf[0])
        _TIFFfreeExt(tif, tf[0]);
    if (tf[1])
        _TIFFfreeExt(tif, tf[1]);
    if (tf[2])
        _TIFFfreeExt(tif, tf[2]);
    tf[0] = tf[1] = tf[2] = 0;
    return 0;
}